

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_yundun_list_instance_infos.cc
# Opt level: O3

int __thiscall
aliyun::Yundun::ListInstanceInfos
          (Yundun *this,YundunListInstanceInfosRequestType *req,
          YundunListInstanceInfosResponseType *response,YundunErrorInfo *error_info)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Int IVar4;
  ArrayIndex AVar5;
  char *pcVar6;
  AliRpcRequest *this_00;
  long *plVar7;
  size_t sVar8;
  Value *pVVar9;
  Value *pVVar10;
  Value *pVVar11;
  size_type *psVar12;
  uint index;
  Value val;
  string secheme;
  string str_response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Reader reader;
  string local_640;
  Value local_620;
  YundunListInstanceInfosResponseType *local_608;
  long *local_600;
  long local_5f8;
  long local_5f0 [2];
  string local_5e0;
  undefined1 local_5c0 [32];
  _Alloc_hider local_5a0;
  size_type local_598;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_590;
  _Alloc_hider local_580;
  size_type local_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_570;
  _Alloc_hider local_560;
  size_type local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  _Alloc_hider local_540;
  size_type local_538;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Alloc_hider local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_510;
  _Alloc_hider local_500;
  size_type local_4f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f0;
  _Alloc_hider local_4e0;
  size_type local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0;
  Int local_4c0;
  Int local_4bc;
  Int local_4b8;
  Int local_4b4;
  Int local_4b0;
  bool local_4ac;
  _Alloc_hider local_4a8;
  size_type local_4a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498;
  Int local_488;
  _Alloc_hider local_480;
  size_type local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  Reader local_140;
  
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  local_5e0._M_string_length = 0;
  local_5e0.field_2._M_local_buf[0] = '\0';
  pcVar6 = "http";
  if ((ulong)this->use_tls_ != 0) {
    pcVar6 = "https";
  }
  local_600 = local_5f0;
  local_608 = response;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_600,pcVar6,pcVar6 + (ulong)this->use_tls_ + 4);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,this->version_,(allocator<char> *)&local_140);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->appid_,(allocator<char> *)&local_640);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->secret_,(allocator<char> *)&local_620);
  local_5c0._0_8_ = local_5c0 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_5c0,local_600,local_5f8 + (long)local_600);
  std::__cxx11::string::append(local_5c0);
  plVar7 = (long *)std::__cxx11::string::append(local_5c0);
  psVar12 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar12) {
    local_460.field_2._M_allocated_capacity = *psVar12;
    local_460.field_2._8_8_ = plVar7[3];
    local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  }
  else {
    local_460.field_2._M_allocated_capacity = *psVar12;
    local_460._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_460._M_string_length = plVar7[1];
  *plVar7 = (long)psVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  AliRpcRequest::AliRpcRequest(this_00,&local_160,&local_180,&local_1a0,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
    operator_delete((void *)local_5c0._0_8_,CONCAT71(local_5c0._17_7_,local_5c0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if (((this->use_tls_ == false) && (pcVar6 = this->proxy_host_, pcVar6 != (char *)0x0)) &&
     (*pcVar6 != '\0')) {
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    sVar8 = strlen(pcVar6);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,pcVar6,pcVar6 + sVar8);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
  }
  Json::Value::Value(&local_620,nullValue);
  Json::Reader::Reader(&local_140);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Action","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"ListInstanceInfos","");
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_200,&local_220);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((req->jst_owner_id)._M_string_length != 0) {
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"JstOwnerId","");
    pcVar1 = (req->jst_owner_id)._M_dataplus._M_p;
    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_260,pcVar1,pcVar1 + (req->jst_owner_id)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_number)._M_string_length != 0) {
    local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"PageNumber","");
    pcVar1 = (req->page_number)._M_dataplus._M_p;
    local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar1,pcVar1 + (req->page_number)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
      operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._M_dataplus._M_p != &local_280.field_2) {
      operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->page_size)._M_string_length != 0) {
    local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"PageSize","");
    pcVar1 = (req->page_size)._M_dataplus._M_p;
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2e0,pcVar1,pcVar1 + (req->page_size)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
      operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->region)._M_string_length != 0) {
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Region","");
    pcVar1 = (req->region)._M_dataplus._M_p;
    local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_320,pcVar1,pcVar1 + (req->region)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->event_type)._M_string_length != 0) {
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"EventType","");
    pcVar1 = (req->event_type)._M_dataplus._M_p;
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar1,pcVar1 + (req->event_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_name)._M_string_length != 0) {
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"InstanceName","");
    pcVar1 = (req->instance_name)._M_dataplus._M_p;
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a0,pcVar1,pcVar1 + (req->instance_name)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_type)._M_string_length != 0) {
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"InstanceType","");
    pcVar1 = (req->instance_type)._M_dataplus._M_p;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e0,pcVar1,pcVar1 + (req->instance_type)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->instance_ids)._M_string_length != 0) {
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"InstanceIds","");
    pcVar1 = (req->instance_ids)._M_dataplus._M_p;
    local_420._M_dataplus._M_p = (pointer)&local_420.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,pcVar1,pcVar1 + (req->instance_ids)._M_string_length);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_420._M_dataplus._M_p != &local_420.field_2) {
      operator_delete(local_420._M_dataplus._M_p,local_420.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"RegionId","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c0,this->region_id_,(allocator<char> *)local_5c0);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_440._M_dataplus._M_p != &local_440.field_2) {
      operator_delete(local_440._M_dataplus._M_p,local_440.field_2._M_allocated_capacity + 1);
    }
  }
  iVar3 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar3 == 0) {
    iVar3 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&local_5e0);
    if (((0 < iVar3) && (local_5e0._M_string_length != 0)) &&
       (bVar2 = Json::Reader::parse(&local_140,&local_5e0,&local_620,true), bVar2)) {
      if (error_info != (YundunErrorInfo *)0x0 && iVar3 != 200) {
        bVar2 = Json::Value::isMember(&local_620,"RequestId");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_5c0,pVVar9);
        }
        else {
          local_5c0._0_8_ = local_5c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_5c0);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,CONCAT71(local_5c0._17_7_,local_5c0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_620,"Code");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_5c0,pVVar9);
        }
        else {
          local_5c0._0_8_ = local_5c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_5c0);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,CONCAT71(local_5c0._17_7_,local_5c0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_620,"HostId");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_5c0,pVVar9);
        }
        else {
          local_5c0._0_8_ = local_5c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_5c0);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,CONCAT71(local_5c0._17_7_,local_5c0[0x10]) + 1);
        }
        bVar2 = Json::Value::isMember(&local_620,"Message");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_5c0,pVVar9);
        }
        else {
          local_5c0._0_8_ = local_5c0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_5c0,anon_var_dwarf_1d3d1e + 9);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_5c0);
        if ((undefined1 *)local_5c0._0_8_ != local_5c0 + 0x10) {
          operator_delete((void *)local_5c0._0_8_,CONCAT71(local_5c0._17_7_,local_5c0[0x10]) + 1);
        }
      }
      if (local_608 != (YundunListInstanceInfosResponseType *)0x0 && iVar3 == 200) {
        bVar2 = Json::Value::isMember(&local_620,"PageNumber");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"PageNumber");
          IVar4 = Json::Value::asInt(pVVar9);
          local_608->page_number = IVar4;
        }
        bVar2 = Json::Value::isMember(&local_620,"PageSize");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"PageSize");
          IVar4 = Json::Value::asInt(pVVar9);
          local_608->page_size = IVar4;
        }
        bVar2 = Json::Value::isMember(&local_620,"TotalCount");
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"TotalCount");
          IVar4 = Json::Value::asInt(pVVar9);
          local_608->total_count = IVar4;
        }
        bVar2 = Json::Value::isMember(&local_620,"InfosList");
        iVar3 = 200;
        if (bVar2) {
          pVVar9 = Json::Value::operator[](&local_620,"InfosList");
          bVar2 = Json::Value::isMember(pVVar9,"InstanceInfo");
          if (bVar2) {
            pVVar9 = Json::Value::operator[](&local_620,"InfosList");
            pVVar9 = Json::Value::operator[](pVVar9,"InstanceInfo");
            bVar2 = Json::Value::isArray(pVVar9);
            if ((bVar2) && (AVar5 = Json::Value::size(pVVar9), AVar5 != 0)) {
              index = 0;
              do {
                local_5c0._0_8_ = local_5c0 + 0x10;
                local_5c0._8_8_ = 0;
                local_5c0[0x10] = '\0';
                local_5a0._M_p = (pointer)&local_590;
                local_598 = 0;
                local_590._M_local_buf[0] = '\0';
                local_580._M_p = (pointer)&local_570;
                local_578 = 0;
                local_570._M_local_buf[0] = '\0';
                local_560._M_p = (pointer)&local_550;
                local_558 = 0;
                local_550._M_local_buf[0] = '\0';
                local_540._M_p = (pointer)&local_530;
                local_538 = 0;
                local_530._M_local_buf[0] = '\0';
                local_520._M_p = (pointer)&local_510;
                local_518 = 0;
                local_510._M_local_buf[0] = '\0';
                local_500._M_p = (pointer)&local_4f0;
                local_4f8 = 0;
                local_4f0._M_local_buf[0] = '\0';
                local_4e0._M_p = (pointer)&local_4d0;
                local_4d8 = 0;
                local_4d0._M_local_buf[0] = '\0';
                local_4a8._M_p = (pointer)&local_498;
                local_4a0 = 0;
                local_498._M_local_buf[0] = '\0';
                local_480._M_p = (pointer)&local_470;
                local_478 = 0;
                local_470._M_local_buf[0] = '\0';
                pVVar10 = Json::Value::operator[](pVVar9,index);
                bVar2 = Json::Value::isMember(pVVar10,"Region");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Region");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)local_5c0,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"RegionName");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"RegionName");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_5a0,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"RegionEnName");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"RegionEnName");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_580,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"InstanceName");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"InstanceName");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_560,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"InstanceId");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"InstanceId");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_540,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"Ip");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Ip");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_520,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"InternetIp");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"InternetIp");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_500,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"IntranetIp");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"IntranetIp");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_4e0,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"Ddos");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Ddos");
                  local_4c0 = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"HostEvent");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"HostEvent");
                  local_4bc = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"SecureCheck");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"SecureCheck");
                  local_4b8 = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"AegisStatus");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"AegisStatus");
                  local_4b4 = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"Waf");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"Waf");
                  local_4b0 = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"IsLock");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"IsLock");
                  local_4ac = Json::Value::asBool(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"LockType");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"LockType");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar11);
                  std::__cxx11::string::operator=((string *)&local_4a8,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar2 = Json::Value::isMember(pVVar10,"UnLockTimes");
                if (bVar2) {
                  pVVar11 = Json::Value::operator[](pVVar10,"UnLockTimes");
                  local_488 = Json::Value::asInt(pVVar11);
                }
                bVar2 = Json::Value::isMember(pVVar10,"TriggerTime");
                if (bVar2) {
                  pVVar10 = Json::Value::operator[](pVVar10,"TriggerTime");
                  Json::Value::asString_abi_cxx11_(&local_640,pVVar10);
                  std::__cxx11::string::operator=((string *)&local_480,(string *)&local_640);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_640._M_dataplus._M_p != &local_640.field_2) {
                    operator_delete(local_640._M_dataplus._M_p,
                                    local_640.field_2._M_allocated_capacity + 1);
                  }
                }
                std::
                vector<aliyun::YundunListInstanceInfosInstanceInfoType,_std::allocator<aliyun::YundunListInstanceInfosInstanceInfoType>_>
                ::push_back(&local_608->infos_list,(value_type *)local_5c0);
                YundunListInstanceInfosInstanceInfoType::~YundunListInstanceInfosInstanceInfoType
                          ((YundunListInstanceInfosInstanceInfoType *)local_5c0);
                AVar5 = Json::Value::size(pVVar9);
                index = index + 1;
              } while (index < AVar5);
            }
          }
        }
      }
      goto LAB_001376b1;
    }
    if (error_info == (YundunErrorInfo *)0x0) goto LAB_001376ac;
    pcVar6 = "parse response failed";
  }
  else {
    if (error_info == (YundunErrorInfo *)0x0) {
LAB_001376ac:
      iVar3 = -1;
      goto LAB_001376b1;
    }
    pcVar6 = "connect to host failed";
  }
  iVar3 = -1;
  std::__cxx11::string::_M_replace
            ((ulong)&error_info->code,0,(char *)(error_info->code)._M_string_length,(ulong)pcVar6);
LAB_001376b1:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.commentsBefore_._M_dataplus._M_p != &local_140.commentsBefore_.field_2) {
    operator_delete(local_140.commentsBefore_._M_dataplus._M_p,
                    local_140.commentsBefore_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.document_._M_dataplus._M_p != &local_140.document_.field_2) {
    operator_delete(local_140.document_._M_dataplus._M_p,
                    local_140.document_.field_2._M_allocated_capacity + 1);
  }
  std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
            (&local_140.errors_);
  std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
            ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_140);
  Json::Value::~Value(&local_620);
  if (local_600 != local_5f0) {
    operator_delete(local_600,local_5f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,
                    CONCAT71(local_5e0.field_2._M_allocated_capacity._1_7_,
                             local_5e0.field_2._M_local_buf[0]) + 1);
  }
  return iVar3;
}

Assistant:

int Yundun::ListInstanceInfos(const YundunListInstanceInfosRequestType& req,
                      YundunListInstanceInfosResponseType* response,
                       YundunErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","ListInstanceInfos");
  if(!req.jst_owner_id.empty()) {
    req_rpc->AddRequestQuery("JstOwnerId", req.jst_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.region.empty()) {
    req_rpc->AddRequestQuery("Region", req.region);
  }
  if(!req.event_type.empty()) {
    req_rpc->AddRequestQuery("EventType", req.event_type);
  }
  if(!req.instance_name.empty()) {
    req_rpc->AddRequestQuery("InstanceName", req.instance_name);
  }
  if(!req.instance_type.empty()) {
    req_rpc->AddRequestQuery("InstanceType", req.instance_type);
  }
  if(!req.instance_ids.empty()) {
    req_rpc->AddRequestQuery("InstanceIds", req.instance_ids);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}